

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pathway.c
# Opt level: O0

void init_pathway(pathway_t *record)

{
  pathway_t *record_local;
  
  strcpy(record->id,"");
  strcpy(record->from_stop_id,"");
  strcpy(record->to_stop_id,"");
  record->mode = PTMD_NOT_SET;
  record->is_bidirectional = PD_NOT_SET;
  record->length = 0.0;
  record->traversal_time = 0;
  record->stair_count = 0;
  record->max_slope = 0.0;
  record->min_width = 0.0;
  strcpy(record->signposted_as,"");
  strcpy(record->reversed_signposted_as,"");
  return;
}

Assistant:

void init_pathway(pathway_t *record) {
    strcpy(record->id, "");
    strcpy(record->from_stop_id, "");
    strcpy(record->to_stop_id, "");
    record->mode = PTMD_NOT_SET,
    record->is_bidirectional = PD_NOT_SET,
    record->length = 0.0,
    record->traversal_time = 0,
    record->stair_count = 0,
    record->max_slope = 0.0,
    record->min_width = 0.0,
    strcpy(record->signposted_as, "");
    strcpy(record->reversed_signposted_as, "");
}